

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBootstrapCommands2.cxx
# Opt level: O3

void GetBootstrapCommands2(vector<cmCommand_*,_std::allocator<cmCommand_*>_> *commands)

{
  pointer *pppcVar1;
  iterator iVar2;
  cmCommand *local_18;
  
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006baaf8;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bab88;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bac18;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0xb8);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmGetPropertyCommand_006ba9d8;
  local_18[1].super_cmObject._vptr_cmObject = (_func_int **)&local_18[1].Helper;
  local_18[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)
   &local_18[1].Helper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  local_18[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_18[1].Error;
  *(undefined8 *)&local_18[1].Enabled = 0;
  *(undefined1 *)&local_18[1].Error._M_dataplus._M_p = 0;
  local_18[1].Error.field_2._M_allocated_capacity = (size_type)(local_18 + 2);
  *(undefined8 *)((long)&local_18[1].Error.field_2 + 8) = 0;
  *(undefined1 *)&local_18[2].super_cmObject._vptr_cmObject = 0;
  *(undefined4 *)
   &local_18[2].Helper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bacc0;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bad50;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bae28;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006baf48;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bafd8;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bb068;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x70);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmInstallCommand_006bb188;
  local_18[1].super_cmObject._vptr_cmObject = (_func_int **)&local_18[1].Helper;
  local_18[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)
   &local_18[1].Helper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0xa8);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmInstallFilesCommand_006bb0f8;
  local_18[1].super_cmObject._vptr_cmObject = (_func_int **)0x0;
  local_18[1].Makefile = (cmMakefile *)0x0;
  local_18[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_18[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_18[1].Error;
  *(undefined8 *)&local_18[1].Enabled = 0;
  *(undefined1 *)&local_18[1].Error._M_dataplus._M_p = 0;
  local_18[1].Error.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&local_18[1].Error.field_2 + 8) = 0;
  local_18[2].super_cmObject._vptr_cmObject = (_func_int **)0x0;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bb218;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bb2a8;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bb338;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bb410;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bb530;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bb5c0;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bb650;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bb6e0;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bb770;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bb800;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bb890;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bb920;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bb9b0;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bba40;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(200);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmSetPropertyCommand_006baa50;
  *(undefined4 *)&local_18[1].Makefile = 0;
  local_18[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_18[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_18[1].Makefile;
  local_18[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_18[1].Makefile;
  *(undefined8 *)&local_18[1].Enabled = 0;
  local_18[1].Error._M_dataplus._M_p = (pointer)&local_18[1].Error.field_2;
  local_18[1].Error._M_string_length = 0;
  local_18[1].Error.field_2._M_local_buf[0] = '\0';
  local_18[2].super_cmObject._vptr_cmObject = (_func_int **)&local_18[2].Helper;
  local_18[2].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)
   &local_18[2].Helper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  *(undefined2 *)
   ((long)&local_18[2].Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined1 *)
   &local_18[2].Helper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 1;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bbbf0;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bbad0;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bbc98;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bbb60;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bbd28;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006baeb8;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bbdb8;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x60);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bbe48;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0xb8);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  local_18[1].super_cmObject._vptr_cmObject = (_func_int **)&local_18[1].Helper;
  local_18[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)
   &local_18[1].Helper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  local_18[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_18[1].Error;
  *(undefined8 *)&local_18[1].Enabled = 0;
  *(undefined1 *)&local_18[1].Error._M_dataplus._M_p = 0;
  local_18[1].Error.field_2._M_allocated_capacity = (size_type)(local_18 + 2);
  *(undefined8 *)((long)&local_18[1].Error.field_2 + 8) = 0;
  *(undefined1 *)&local_18[2].super_cmObject._vptr_cmObject = 0;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCoreTryCompile_006bbed8;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x158);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  local_18[1].super_cmObject._vptr_cmObject = (_func_int **)&local_18[1].Helper;
  local_18[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)
   &local_18[1].Helper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  local_18[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_18[1].Error;
  *(undefined8 *)&local_18[1].Enabled = 0;
  *(undefined1 *)&local_18[1].Error._M_dataplus._M_p = 0;
  local_18[1].Error.field_2._M_allocated_capacity = (size_type)(local_18 + 2);
  *(undefined8 *)((long)&local_18[1].Error.field_2 + 8) = 0;
  *(undefined1 *)&local_18[2].super_cmObject._vptr_cmObject = 0;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmTryRunCommand_006bbf68;
  local_18[2].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_18[2].Enabled;
  local_18[2].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18[2].Enabled = false;
  local_18[2].Error._M_string_length = (size_type)((long)&local_18[2].Error.field_2 + 8);
  local_18[2].Error.field_2._M_allocated_capacity = 0;
  local_18[2].Error.field_2._M_local_buf[8] = '\0';
  local_18[3].Makefile =
       (cmMakefile *)
       &local_18[3].Helper.Arguments.
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_finish;
  local_18[3].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined1 *)
   &local_18[3].Helper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  *(size_type **)&local_18[3].Enabled = &local_18[3].Error._M_string_length;
  local_18[3].Error._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&local_18[3].Error._M_string_length = 0;
  *(cmMakefile ***)((long)&local_18[3].Error.field_2 + 8) = &local_18[4].Makefile;
  local_18[4].super_cmObject._vptr_cmObject = (_func_int **)0x0;
  *(undefined1 *)&local_18[4].Makefile = 0;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bbff8;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_18;
    iVar2._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_18 = (cmCommand *)operator_new(0x50);
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Error)._M_dataplus._M_p = (pointer)&(local_18->Error).field_2;
  (local_18->Error)._M_string_length = 0;
  (local_18->Error).field_2._M_local_buf[0] = '\0';
  local_18->Makefile = (cmMakefile *)0x0;
  local_18->Enabled = true;
  (local_18->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006bc088;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,&local_18);
  }
  else {
    *iVar2._M_current = local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return;
}

Assistant:

void GetBootstrapCommands2(std::vector<cmCommand*>& commands)
{
  commands.push_back(new cmGetCMakePropertyCommand);
  commands.push_back(new cmGetDirectoryPropertyCommand);
  commands.push_back(new cmGetFilenameComponentCommand);
  commands.push_back(new cmGetPropertyCommand);
  commands.push_back(new cmGetSourceFilePropertyCommand);
  commands.push_back(new cmGetTargetPropertyCommand);
  commands.push_back(new cmIfCommand);
  commands.push_back(new cmIncludeCommand);
  commands.push_back(new cmIncludeDirectoryCommand);
  commands.push_back(new cmIncludeRegularExpressionCommand);
  commands.push_back(new cmInstallCommand);
  commands.push_back(new cmInstallFilesCommand);
  commands.push_back(new cmInstallTargetsCommand);
  commands.push_back(new cmLinkDirectoriesCommand);
  commands.push_back(new cmListCommand);
  commands.push_back(new cmMacroCommand);
  commands.push_back(new cmMakeDirectoryCommand);
  commands.push_back(new cmMarkAsAdvancedCommand);
  commands.push_back(new cmMathCommand);
  commands.push_back(new cmMessageCommand);
  commands.push_back(new cmOptionCommand);
  commands.push_back(new cmProjectCommand);
  commands.push_back(new cmReturnCommand);
  commands.push_back(new cmSeparateArgumentsCommand);
  commands.push_back(new cmSetCommand);
  commands.push_back(new cmSetDirectoryPropertiesCommand);
  commands.push_back(new cmSetPropertyCommand);
  commands.push_back(new cmSetSourceFilesPropertiesCommand);
  commands.push_back(new cmSetTargetPropertiesCommand);
  commands.push_back(new cmGetTestPropertyCommand);
  commands.push_back(new cmSetTestsPropertiesCommand);
  commands.push_back(new cmSiteNameCommand);
  commands.push_back(new cmStringCommand);
  commands.push_back(new cmSubdirCommand);
  commands.push_back(new cmTargetLinkLibrariesCommand);
  commands.push_back(new cmTryCompileCommand);
  commands.push_back(new cmTryRunCommand);
  commands.push_back(new cmUnsetCommand);
  commands.push_back(new cmWhileCommand);
}